

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

cmUVProcessChain * __thiscall
cmUVProcessChain::operator=(cmUVProcessChain *this,cmUVProcessChain *other)

{
  cmUVProcessChain *other_local;
  cmUVProcessChain *this_local;
  
  std::
  unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>::
  operator=(&this->Data,&other->Data);
  return this;
}

Assistant:

cmUVProcessChain& cmUVProcessChain::operator=(
  cmUVProcessChain&& other) noexcept
{
  this->Data = std::move(other.Data);
  return *this;
}